

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::callLoggingExit
          (CLIntercept *this,char *functionName,cl_int errorCode,cl_event *event,
          cl_sync_point_khr *syncPoint,char *formatStr,...)

{
  char in_AL;
  undefined8 *in_RCX;
  undefined4 in_EDX;
  char *in_RSI;
  CLIntercept *in_RDI;
  uint *in_R8;
  char *in_R9;
  CEnumNameMap *in_XMM0_Qa;
  double __x;
  int size;
  string str;
  va_list args;
  lock_guard<std::mutex> lock;
  string *in_stack_000001c8;
  CLIntercept *in_stack_000001d0;
  mutex_type *in_stack_fffffffffffffe48;
  char *__s;
  char *in_stack_fffffffffffffe50;
  undefined1 local_198 [40];
  undefined4 in_stack_fffffffffffffe90;
  cl_int in_stack_fffffffffffffe94;
  CEnumNameMap *in_stack_fffffffffffffe98;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  int local_88;
  string local_78 [32];
  undefined4 local_58;
  undefined4 local_54;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_30;
  uint *local_28;
  undefined8 *local_20;
  undefined4 local_14;
  char *local_10;
  CLIntercept *local_8;
  
  if (in_AL != '\0') {
    in_stack_fffffffffffffe98 = in_XMM0_Qa;
  }
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  local_48 = local_198;
  local_50 = &stack0x00000008;
  local_54 = 0x30;
  local_58 = 0x30;
  std::__cxx11::string::string(local_78);
  getCallLoggingPrefix(in_stack_000001d0,in_stack_000001c8);
  std::__cxx11::string::operator+=(local_78,local_10);
  if (local_20 != (undefined8 *)0x0) {
    in_stack_fffffffffffffe50 = in_RDI->m_StringBuffer;
    snprintf(in_stack_fffffffffffffe50,0x4000," created event = %p",*local_20);
    std::__cxx11::string::operator+=(local_78,in_stack_fffffffffffffe50);
  }
  if (local_28 != (uint *)0x0) {
    __s = in_RDI->m_StringBuffer;
    snprintf(__s,0x4000," is sync point = %u",(ulong)*local_28);
    std::__cxx11::string::operator+=(local_78,__s);
  }
  local_88 = vsnprintf(in_RDI->m_StringBuffer,0x4000,local_30,&local_58);
  if ((local_88 < 0) || (0x3fff < local_88)) {
    std::__cxx11::string::operator+=(local_78,": too long");
  }
  else {
    std::__cxx11::string::operator+=(local_78,": ");
    std::__cxx11::string::operator+=(local_78,in_RDI->m_StringBuffer);
  }
  std::__cxx11::string::operator+=(local_78," -> ");
  CEnumNameMap::name_abi_cxx11_(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
  std::__cxx11::string::operator+=(local_78,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::operator+((char *)in_stack_fffffffffffffe98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  __x = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_RDI,in_stack_fffffffffffffe50);
  log(in_RDI,__x);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_78);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1ee361);
  return;
}

Assistant:

void CLIntercept::callLoggingExit(
    const char* functionName,
    const cl_int errorCode,
    const cl_event* event,
    const cl_sync_point_khr* syncPoint,
    const char* formatStr,
    ... )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    va_list args;
    va_start( args, formatStr );

    std::string str;
    getCallLoggingPrefix( str );

    str += functionName;

    if( event )
    {
        CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " created event = %p", *event );
        str += m_StringBuffer;
    }
    if( syncPoint )
    {
        CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " is sync point = %u", *syncPoint );
        str += m_StringBuffer;
    }

    int size = CLI_VSPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, formatStr, args );
    if( size >= 0 && size < CLI_STRING_BUFFER_SIZE )
    {
        str += ": ";
        str += m_StringBuffer;
    }
    else
    {
        str += ": too long";
    }

    str += " -> ";
    str += m_EnumNameMap.name( errorCode );

    log( "<<<< " + str + "\n" );

    va_end( args );
}